

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qproperty_p.h
# Opt level: O1

void __thiscall QPropertyObserverPointer::unlink_common(QPropertyObserverPointer *this)

{
  ulong uVar1;
  QPropertyObserver *pQVar2;
  ulong *puVar3;
  
  uVar1 = (this->ptr->super_QPropertyObserverBase).next.d;
  if (7 < uVar1) {
    *(quintptr **)((uVar1 & 0xfffffffffffffff8) + 8) =
         (this->ptr->super_QPropertyObserverBase).prev.d;
  }
  pQVar2 = this->ptr;
  puVar3 = (pQVar2->super_QPropertyObserverBase).prev.d;
  if (puVar3 != (ulong *)0x0) {
    *puVar3 = (ulong)((uint)*puVar3 & 7) |
              (pQVar2->super_QPropertyObserverBase).next.d & 0xfffffffffffffff8;
  }
  (pQVar2->super_QPropertyObserverBase).next.d = (pQVar2->super_QPropertyObserverBase).next.d & 7;
  (pQVar2->super_QPropertyObserverBase).prev.d = (quintptr *)0x0;
  return;
}

Assistant:

void unlink_common()
    {
        if (ptr->next)
            ptr->next->prev = ptr->prev;
        if (ptr->prev)
            ptr->prev.setPointer(ptr->next.data());
        ptr->next = nullptr;
        ptr->prev.clear();
    }